

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::AdapterPromiseNode<capnp::Capability::Client,_kj::Canceler::AdapterImpl<capnp::Capability::Client>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<capnp::Capability::Client,kj::Canceler::AdapterImpl<capnp::Capability::Client>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<capnp::Capability::Client>>
          (PromiseDisposer *this,Canceler *params,Promise<capnp::Capability::Client> *params_1)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  AdapterPromiseNode<capnp::Capability::Client,kj::Canceler::AdapterImpl<capnp::Capability::Client>>
  ::AdapterPromiseNode<kj::Canceler&,kj::Promise<capnp::Capability::Client>>
            ((AdapterPromiseNode<capnp::Capability::Client,kj::Canceler::AdapterImpl<capnp::Capability::Client>>
              *)((long)pvVar1 + 0x200),params,params_1);
  *(void **)((long)pvVar1 + 0x208) = pvVar1;
  *(AdapterPromiseNode<capnp::Capability::Client,kj::Canceler::AdapterImpl<capnp::Capability::Client>>
    **)this = (AdapterPromiseNode<capnp::Capability::Client,kj::Canceler::AdapterImpl<capnp::Capability::Client>>
               *)((long)pvVar1 + 0x200);
  return (Own<kj::_::AdapterPromiseNode<capnp::Capability::Client,_kj::Canceler::AdapterImpl<capnp::Capability::Client>_>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<capnp::Capability::Client,_kj::Canceler::AdapterImpl<capnp::Capability::Client>_>
            *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }